

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

void __thiscall
icu_63::MessagePattern::setParseError(MessagePattern *this,UParseError *parseError,int32_t index)

{
  int iVar1;
  int32_t start;
  char16_t cVar2;
  int start_00;
  Char16Ptr local_40 [3];
  Char16Ptr local_28;
  int local_20;
  int32_t local_1c;
  int32_t length;
  int32_t index_local;
  UParseError *parseError_local;
  MessagePattern *this_local;
  
  if (parseError != (UParseError *)0x0) {
    parseError->offset = index;
    local_20 = index;
    local_1c = index;
    _length = parseError;
    parseError_local = (UParseError *)this;
    if (0xf < index) {
      local_20 = 0xf;
      cVar2 = UnicodeString::operator[](&this->msg,index + -0xf);
      if ((cVar2 & 0xfc00U) == 0xdc00) {
        local_20 = local_20 + -1;
      }
    }
    iVar1 = local_20;
    start_00 = local_1c - local_20;
    Char16Ptr::Char16Ptr(&local_28,_length->preContext);
    UnicodeString::extract(&this->msg,start_00,iVar1,&local_28,0);
    Char16Ptr::~Char16Ptr(&local_28);
    _length->preContext[local_20] = L'\0';
    local_20 = UnicodeString::length(&this->msg);
    local_20 = local_20 - local_1c;
    if (0xf < local_20) {
      local_20 = 0xf;
      cVar2 = UnicodeString::operator[](&this->msg,local_1c + 0xe);
      if ((cVar2 & 0xfc00U) == 0xd800) {
        local_20 = local_20 + -1;
      }
    }
    start = local_1c;
    iVar1 = local_20;
    Char16Ptr::Char16Ptr(local_40,_length->postContext);
    UnicodeString::extract(&this->msg,start,iVar1,local_40,0);
    Char16Ptr::~Char16Ptr(local_40);
    _length->postContext[local_20] = L'\0';
  }
  return;
}

Assistant:

void
MessagePattern::setParseError(UParseError *parseError, int32_t index) {
    if(parseError==NULL) {
        return;
    }
    parseError->offset=index;

    // Set preContext to some of msg before index.
    // Avoid splitting a surrogate pair.
    int32_t length=index;
    if(length>=U_PARSE_CONTEXT_LEN) {
        length=U_PARSE_CONTEXT_LEN-1;
        if(length>0 && U16_IS_TRAIL(msg[index-length])) {
            --length;
        }
    }
    msg.extract(index-length, length, parseError->preContext);
    parseError->preContext[length]=0;

    // Set postContext to some of msg starting at index.
    length=msg.length()-index;
    if(length>=U_PARSE_CONTEXT_LEN) {
        length=U_PARSE_CONTEXT_LEN-1;
        if(length>0 && U16_IS_LEAD(msg[index+length-1])) {
            --length;
        }
    }
    msg.extract(index, length, parseError->postContext);
    parseError->postContext[length]=0;
}